

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *filename;
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ostream *poVar3;
  undefined8 extraout_RAX;
  Reactor *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  string local_118;
  FileInputSource is;
  
  if (0xfffffffd < argc - 4U) {
    filename = argv[1];
    local_138 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (argc == 3) {
      iVar1 = strcmp(argv[2],"--react");
      if (iVar1 != 0) goto LAB_0011b036;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      is.super_InputSource._vptr_InputSource = (_func_int **)&__a2;
      p_Var2->_M_use_count = 1;
      p_Var2->_M_weak_count = 1;
      p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002aba40;
      local_138 = p_Var2 + 1;
      p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Reactor_002aba90;
      is.super_InputSource.last_offset = 0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::Reactor,_std::allocator<(anonymous_namespace)::Reactor>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::Reactor,_std::allocator<(anonymous_namespace)::Reactor>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&is);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      is.super_InputSource._vptr_InputSource = (_func_int **)0x0;
      is.super_InputSource.last_offset = (qpdf_offset_t)_Stack_130._M_pi;
      _Stack_130._M_pi = p_Var2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&is.super_InputSource.last_offset);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118._M_string_length);
    }
    FileInputSource::FileInputSource(&is,filename);
    JSON::parse((JSON *)&__a2,&is.super_InputSource,(Reactor *)local_138);
    JSON::unparse_abi_cxx11_(&local_118,(JSON *)&__a2);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_118);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
    FileInputSource::~FileInputSource(&is);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_130);
    return 0;
  }
  usage();
LAB_0011b036:
  usage();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_130);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((argc < 2) || (argc > 3)) {
        usage();
        return 2;
    }
    char const* filename = argv[1];
    std::shared_ptr<Reactor> reactor;
    if (argc == 3) {
        if (strcmp(argv[2], "--react") == 0) {
            reactor = std::make_shared<Reactor>();
        } else {
            usage();
        }
    }
    try {
        FileInputSource is(filename);
        std::cout << JSON::parse(is, reactor.get()).unparse() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << filename << ": " << e.what() << std::endl;
        return 2;
    }
    return 0;
}